

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Netlist.h
# Opt level: O1

string * __thiscall
netlist::NetlistVariableReference::toString_abi_cxx11_
          (string *__return_storage_ptr__,NetlistVariableReference *this)

{
  int iVar1;
  Symbol *pSVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view fmt;
  format_args args;
  char *local_38;
  size_t local_30;
  int local_28;
  int local_18;
  
  pSVar2 = (this->super_NetlistNode).symbol;
  local_30 = (pSVar2->name)._M_len;
  local_18 = (this->bounds).left;
  iVar1 = (this->bounds).right;
  local_28 = iVar1;
  if (iVar1 < local_18) {
    local_28 = local_18;
  }
  local_38 = (pSVar2->name)._M_str;
  if (iVar1 < local_18) {
    local_18 = iVar1;
  }
  fmt.size_ = 0x11d;
  fmt.data_ = (char *)0x9;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_38;
  ::fmt::v11::vformat_abi_cxx11_(__return_storage_ptr__,(v11 *)"{}[{}:{}]",fmt,args);
  return __return_storage_ptr__;
}

Assistant:

std::string toString() const {
        return fmt::format("{}[{}:{}]", getName(), bounds.upper(), bounds.lower());
    }